

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O3

void aes_sw_setiv_sdctr(ssh_cipher *ciph,void *viv)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  
  lVar4 = 0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    uVar1 = *(ulong *)((long)viv + lVar4 * -8 + 8);
    ciph[lVar4 + -0xb].vt =
         (ssh_cipheralg *)
         (uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
          (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
          (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
    lVar4 = 1;
    bVar2 = false;
  } while (bVar3);
  ciph[-1].vt = (ssh_cipheralg *)(ciph + -1);
  return;
}

Assistant:

static void aes_sw_setiv_sdctr(ssh_cipher *ciph, const void *viv)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);
    const uint8_t *iv = (const uint8_t *)viv;

    /* Import the initial counter value into the internal representation */
    for (unsigned i = 0; i < SDCTR_WORDS; i++)
        ctx->iv.sdctr.counter[i] =
            GET_BIGNUMINT_MSB_FIRST(
                iv + 16 - BIGNUM_INT_BYTES - i*BIGNUM_INT_BYTES);

    /* Set keystream_pos to indicate that the keystream cache is
     * currently empty */
    ctx->iv.sdctr.keystream_pos =
        ctx->iv.sdctr.keystream + sizeof(ctx->iv.sdctr.keystream);
}